

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

char * nrv_alloc(char *s,char *s0,size_t s0len,char **rve,int n)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = rv_alloc((int)s0len);
  for (lVar3 = 0; cVar1 = s[lVar3], pcVar2[lVar3] = cVar1, cVar1 != '\0'; lVar3 = lVar3 + 1) {
  }
  if (s0 != (char *)0x0) {
    *(char **)s0 = pcVar2 + lVar3;
  }
  return pcVar2;
}

Assistant:

static char *
nrv_alloc(const char *s, char *s0, size_t s0len, char **rve, int n MTd)
{
	char *rv, *t;

	if (!s0)
		s0 = rv_alloc(n MTa);
	else if (s0len <= n) {
		rv = 0;
		t = rv + n;
		goto rve_chk;
		}
	t = rv = s0;
	while((*t = *s++))
		++t;
 rve_chk:
	if (rve)
		*rve = t;
	return rv;
	}